

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmLea<(moira::Instr)67,(moira::Mode)9,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  char *pcVar5;
  StrWriter *pSVar6;
  Ea<(moira::Mode)9,_(moira::Size)4> src;
  Ea<(moira::Mode)9,_(moira::Size)4> local_2c;
  
  local_2c.reg = op & 7;
  local_2c.pc = *addr;
  *addr = local_2c.pc + 2;
  local_2c.ext1 = (*this->_vptr_Moira[5])();
  local_2c.ext1 = local_2c.ext1 & 0xffff;
  pcVar5 = "lea";
  if (str->upper != false) {
    pcVar5 = "LEA";
  }
  cVar1 = *pcVar5;
  while (cVar1 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar1;
    cVar1 = *pcVar5;
  }
  iVar2 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar2) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  pSVar6 = StrWriter::operator<<(str,&local_2c);
  pcVar5 = pSVar6->ptr;
  pSVar6->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  pcVar5 = pSVar6->ptr;
  pSVar6->ptr = pcVar5 + 1;
  *pcVar5 = ' ';
  pcVar5 = pSVar6->ptr;
  pSVar6->ptr = pcVar5 + 1;
  *pcVar5 = 'A';
  pbVar4 = (byte *)pSVar6->ptr;
  pSVar6->ptr = (char *)(pbVar4 + 1);
  *pbVar4 = (byte)(op >> 9) & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmLea(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = An       ( ____xxx_________(op)       );

    str << Ins<I>{} << tab << src << ", " << dst;
}